

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::errorRespondDelayedMessages(CommonCore *this,string_view estring)

{
  undefined4 index;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  char *local_1c8;
  size_t local_1c0;
  optional<helics::ActionMessage> msg;
  _Optional_payload_base<helics::ActionMessage> local_f0;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            (&msg,&this->delayTransmitQueue);
  while (index = msg.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                 super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                 super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageID,
        msg.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
        super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
        super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
    if ((msg.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
         super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
         super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageAction |
        ~priority_null_info_command) == cmd_broker_query) {
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x9;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_1c8;
      local_1c8 = estring._M_str;
      local_1c0 = estring._M_len;
      ::fmt::v11::vformat_abi_cxx11_((string *)&local_f0,(v11 *)"#error:{}",fmt,args);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(&this->activeQueries,index,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
              ((optional<helics::ActionMessage> *)&local_f0,&this->delayTransmitQueue);
    std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
              ((_Optional_payload_base<helics::ActionMessage> *)&msg,&local_f0);
    std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_f0);
  }
  std::_Optional_payload_base<helics::ActionMessage>::_M_reset
            ((_Optional_payload_base<helics::ActionMessage> *)&msg);
  return;
}

Assistant:

void CommonCore::errorRespondDelayedMessages(std::string_view estring)
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if ((*msg).action() == CMD_QUERY ||
            (*msg).action() == CMD_BROKER_QUERY) {  // deal with in flight queries that will block
                                                    // unless a response is given
            activeQueries.setDelayedValue((*msg).messageID, fmt::format("#error:{}", estring));
        }
        // else other message which might get into here shouldn't need any action, just drop them
        msg = delayTransmitQueue.pop();
    }
}